

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ontrak.cpp
# Opt level: O3

int GetInitialDevicesState(void)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  
  iVar1 = GetDeviceCurrentState("CurArmadeusState.txt",&bArmadeusON);
  iVar2 = 1;
  if (iVar1 == 0) {
    iVar1 = GetDeviceCurrentState("CurBottomPumpState.txt",&bBottomPumpON);
    if (iVar1 == 0) {
      iVar1 = GetDeviceCurrentState("CurSurfacePumpState.txt",&bSurfacePumpON);
      if (iVar1 == 0) {
        iVar1 = GetDeviceCurrentState("CurProbeState.txt",&bProbeON);
        if (iVar1 == 0) {
          iVar1 = GetDeviceCurrentState("CurWifiState.txt",&bWifiON);
          if (iVar1 == 0) {
            iVar1 = GetDeviceCurrentState("CurIridiumState.txt",&bIridiumON);
            if (iVar1 == 0) {
              iVar1 = GetDeviceCurrentState("CurSailMotorState.txt",&bSailMotorON);
              if (iVar1 == 0) {
                puts("Devices default state : ");
                pcVar4 = "ON";
                pcVar3 = "ON";
                if (bArmadeusON == 0) {
                  pcVar3 = "OFF";
                }
                iVar2 = 0;
                printf("   Armadeus : %s\n",pcVar3);
                pcVar3 = "ON";
                if (bBottomPumpON == 0) {
                  pcVar3 = "OFF";
                }
                printf("   Bottom pump : %s\n",pcVar3);
                pcVar3 = "ON";
                if (bSurfacePumpON == 0) {
                  pcVar3 = "OFF";
                }
                printf("   Surface pump : %s\n",pcVar3);
                pcVar3 = "ON";
                if (bProbeON == 0) {
                  pcVar3 = "OFF";
                }
                printf("   Probe : %s\n",pcVar3);
                pcVar3 = "ON";
                if (bWifiON == 0) {
                  pcVar3 = "OFF";
                }
                printf("   Wi-Fi : %s\n",pcVar3);
                pcVar3 = "ON";
                if (bIridiumON == 0) {
                  pcVar3 = "OFF";
                }
                printf("   Iridium : %s\n",pcVar3);
                if (bSailMotorON == 0) {
                  pcVar4 = "OFF";
                }
                printf("   Sail motor : %s\n",pcVar4);
                fflush(_stdout);
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int GetInitialDevicesState(void)
{
	if (GetDeviceCurrentState("CurArmadeusState.txt", &bArmadeusON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (GetDeviceCurrentState("CurBottomPumpState.txt", &bBottomPumpON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (GetDeviceCurrentState("CurSurfacePumpState.txt", &bSurfacePumpON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (GetDeviceCurrentState("CurProbeState.txt", &bProbeON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (GetDeviceCurrentState("CurWifiState.txt", &bWifiON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (GetDeviceCurrentState("CurIridiumState.txt", &bIridiumON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (GetDeviceCurrentState("CurSailMotorState.txt", &bSailMotorON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	printf("Devices default state : \n");
	printf("   Armadeus : %s\n", bArmadeusON? "ON": "OFF");
	printf("   Bottom pump : %s\n", bBottomPumpON? "ON": "OFF");
	printf("   Surface pump : %s\n", bSurfacePumpON? "ON": "OFF");
	printf("   Probe : %s\n", bProbeON? "ON": "OFF");
	printf("   Wi-Fi : %s\n", bWifiON? "ON": "OFF");
	printf("   Iridium : %s\n", bIridiumON? "ON": "OFF");
	printf("   Sail motor : %s\n", bSailMotorON? "ON": "OFF");
	fflush(stdout);

	return EXIT_SUCCESS;
}